

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  FractionalInteger *pFVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  this;
  ulong uVar5;
  FractionalInteger *pFVar6;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  fracint1;
  bool bVar7;
  anon_class_8_1_8991fb9c comp_local;
  FractionalInteger local_68;
  
  if (begin._M_current == end._M_current) {
LAB_002eb3b2:
    bVar7 = true;
  }
  else {
    uVar5 = 0;
    fracint1._M_current = begin._M_current;
    comp_local.this = comp.this;
    do {
      lVar2 = -(long)fracint1._M_current;
      do {
        lVar4 = lVar2;
        pFVar6 = fracint1._M_current;
        fracint1._M_current = pFVar6 + 1;
        bVar7 = fracint1._M_current == end._M_current;
        if (bVar7) goto LAB_002eb3b2;
        bVar3 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          (&comp_local,fracint1._M_current,pFVar6);
        lVar2 = lVar4 + -0x38;
      } while (!bVar3);
      local_68.fractionality = (fracint1._M_current)->fractionality;
      local_68._20_8_ = *(undefined8 *)((long)&pFVar6[1].score + 4);
      local_68.score._0_4_ =
           (undefined4)((ulong)*(undefined8 *)((long)&pFVar6[1].row_ep_norm2 + 4) >> 0x20);
      local_68.row_ep_norm2._0_4_ = SUB84(pFVar6[1].row_ep_norm2,0);
      local_68.row_ep_norm2._4_4_ = (undefined4)((ulong)pFVar6[1].row_ep_norm2 >> 0x20);
      local_68.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           pFVar6[1].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_68.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           pFVar6[1].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_68.row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           pFVar6[1].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar6[1].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pFVar6[1].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pFVar6[1].row_ep.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pFVar6 = fracint1._M_current;
      do {
        pFVar1 = pFVar6 + -1;
        FractionalInteger::operator=(pFVar6,pFVar1);
        this._M_current = begin._M_current;
        if (pFVar1 == begin._M_current) break;
        bVar3 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                          (&comp_local,&local_68,pFVar6 + -2);
        this._M_current = pFVar1;
        pFVar6 = pFVar1;
      } while (bVar3);
      FractionalInteger::operator=(this._M_current,&local_68);
      uVar5 = uVar5 + -((long)&this._M_current[-1].fractionality + lVar4) / 0x38;
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base(&local_68.row_ep.
                     super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   );
    } while (uVar5 < 9);
  }
  return bVar7;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }